

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::args::SsboArgs::setSingleValue
          (SsboArgs *this,SsboArgData *argData)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  string message;
  char *local_1b8;
  long local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b0 = 0;
  local_1a8 = '\0';
  local_1b8 = &local_1a8;
  switch(argData->member) {
  case ARGMEMBER_FORMAT:
    lVar2 = 0x20;
    break;
  case ARGMEMBER_BINDING_POINT:
    lVar2 = 0x40;
    break;
  case ARGMEMBER_MATRIX_ORDER:
    lVar2 = 0x60;
    break;
  case ARGMEMBER_MEMBER_TYPE:
    lVar2 = 0x80;
    break;
  case ARGMEMBER_NAME:
    lVar2 = 0xa0;
    break;
  case ARGMEMBER_FIXED_ARRAY:
    lVar2 = 0xc0;
    break;
  case ARGMEMBER_VARIABLE_ARRAY:
    lVar2 = 0xe0;
    break;
  case ARGMEMBER_REORDER:
    iVar1 = std::__cxx11::string::compare((char *)&argData->data);
    if (iVar1 == 0) {
      this->m_memberReorder = true;
    }
    goto LAB_0166d465;
  default:
    std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)0x0,0x1c8a32f);
    local_198._0_8_ = this->m_testLog;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_1b8,local_1b0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    goto LAB_0166d465;
  }
  std::__cxx11::string::_M_assign
            ((string *)((long)&(this->m_negativeContextVersion)._M_dataplus._M_p + lVar2));
LAB_0166d465:
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  return;
}

Assistant:

void SsboArgs::setSingleValue (const SsboArgData argData)
{
	std::string message;

	switch (argData.member)
	{
		case ARGMEMBER_FORMAT:
			m_stdFormat					=	argData.data;
			return;
		case ARGMEMBER_BINDING_POINT:
			m_bindingPoint				=	argData.data;
			return;
		case ARGMEMBER_MATRIX_ORDER:
			m_matrixOrder				=	argData.data;
			return;
		case ARGMEMBER_MEMBER_TYPE:
			m_memberType				=	argData.data;
			return;
		case ARGMEMBER_NAME:
			m_memberName				=	argData.data;
			return;
		case ARGMEMBER_FIXED_ARRAY:
			m_memberFixedArrayerName	=	argData.data;
			return;
		case ARGMEMBER_VARIABLE_ARRAY:
			m_memberVariableArray		=	argData.data;
			return;
		case ARGMEMBER_REORDER:
			if (argData.data == "true")
			{
				m_memberReorder			=	true;
			}
			return;
		default:
			message = "auto loop argument data member not recognised.";
			m_testLog << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
	}
}